

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  void *local_30;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if ((pTVar1->field_2).it == 0xfffffff3) {
    local_30 = (void *)((ulong)(pTVar1->u32).lo + 0x18);
  }
  else if ((int)(pTVar1->field_2).it >> 0xf == -2) {
    local_30 = (void *)((ulong)*(uint *)((ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x88) +
                                        (pTVar1->u64 >> 0x27 & 0xff) * 4) << 0x20 |
                       pTVar1->u64 & 0x7fffffffff);
  }
  else {
    local_30 = (void *)0x0;
  }
  return local_30;
}

Assistant:

LUA_API void *lua_touserdata(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(G(L), o);
  else
    return NULL;
}